

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int process_compound_inter_mode
              (AV1_COMP *cpi,MACROBLOCK *x,HandleInterModeArgs *args,int64_t ref_best_rd,
              int_mv *cur_mv,BLOCK_SIZE bsize,int *compmode_interinter_cost,
              CompoundTypeRdBuffers *rd_buffers,BUFFER_SET *orig_dst,BUFFER_SET *tmp_dst,
              int *rate_mv,RD_STATS *rd_stats,int64_t *skip_rd,int *skip_build_pred)

{
  BUFFER_SET dst;
  int iVar1;
  MACROBLOCKD *xd_00;
  long lVar2;
  int64_t in_RCX;
  long in_RSI;
  long in_RDI;
  int *in_stack_00000008;
  undefined1 (*in_stack_00000018) [12];
  long in_stack_00000038;
  undefined4 *in_stack_00000040;
  int comp_type_rd_scale;
  int comp_type_rd_shift;
  int64_t rd_thresh;
  int64_t best_rd_compound;
  int is_luma_interp_done;
  int mi_col;
  int mi_row;
  int num_planes;
  int mode_search_mask;
  int masked_compound_used;
  AV1_COMMON *cm;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int in_stack_00000424;
  int_mv *in_stack_00000428;
  BLOCK_SIZE in_stack_00000437;
  HandleInterModeArgs *in_stack_00000438;
  MACROBLOCK *in_stack_00000440;
  AV1_COMP *in_stack_00000448;
  int in_stack_00000490;
  BUFFER_SET *in_stack_00000498;
  BUFFER_SET *in_stack_000004a0;
  CompoundTypeRdBuffers *in_stack_000004a8;
  int *in_stack_000004b0;
  int64_t *in_stack_000004b8;
  RD_STATS *in_stack_000004c0;
  int64_t in_stack_000004c8;
  int64_t in_stack_000004d0;
  int *in_stack_000004d8;
  int64_t in_stack_000004e0;
  undefined4 in_stack_fffffffffffffedc;
  InterpFilter frame_interp_filter;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int64_t iVar3;
  BUFFER_SET *ctx;
  int *piVar4;
  AV1_COMMON *in_stack_ffffffffffffff30;
  MACROBLOCKD *pMVar5;
  int in_stack_ffffffffffffff48;
  bool local_b1;
  long local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined4 local_88;
  uint local_84;
  AV1_COMMON *local_80;
  long local_78;
  MACROBLOCKD *local_70;
  int64_t local_58;
  int local_34;
  
  frame_interp_filter = (InterpFilter)((uint)in_stack_fffffffffffffedc >> 0x18);
  local_70 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_78 = **(long **)(in_RSI + 0x2058);
  local_80 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_58 = in_RCX;
  iVar1 = is_any_masked_compound_used((BLOCK_SIZE)((uint)in_stack_fffffffffffffee0 >> 0x18));
  local_b1 = false;
  if (iVar1 != 0) {
    local_b1 = local_80->seq_params->enable_masked_compound != '\0';
  }
  local_84 = (uint)local_b1;
  local_88 = 0xf;
  local_8c = av1_num_planes(local_80);
  local_90 = local_70->mi_row;
  local_94 = local_70->mi_col;
  local_98 = 0;
  set_default_interp_filters
            ((MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             frame_interp_filter);
  xd_00 = (MACROBLOCKD *)get_rd_thresh_from_best_rd(local_58,0x10,0xb);
  ctx = *(BUFFER_SET **)(in_stack_00000038 + 8);
  piVar4 = &local_98;
  iVar3 = local_58;
  pMVar5 = xd_00;
  iVar1 = av1_compound_type_rd
                    (in_stack_00000448,in_stack_00000440,in_stack_00000438,in_stack_00000437,
                     in_stack_00000428,in_stack_00000424,in_stack_00000490,in_stack_00000498,
                     in_stack_000004a0,in_stack_000004a8,in_stack_000004b0,in_stack_000004b8,
                     in_stack_000004c0,in_stack_000004c8,in_stack_000004d0,in_stack_000004d8,
                     in_stack_000004e0);
  *in_stack_00000008 = iVar1;
  if ((local_58 < 0x7fffffffffffffff) &&
     (lVar2 = (local_a0 >> 4) * 0xb, lVar2 - local_58 != 0 && local_58 <= lVar2)) {
    dst.plane[1]._4_4_ = (int)((ulong)*(undefined8 *)(*in_stack_00000018 + 8) >> 0x20);
    dst.plane._0_12_ = *in_stack_00000018;
    dst.plane[2] = (uint8_t *)*(undefined8 *)(in_stack_00000018[1] + 4);
    dst.stride._0_8_ = *(undefined8 *)in_stack_00000018[2];
    dst._32_8_ = *(undefined8 *)(in_stack_00000018[2] + 8);
    restore_dst_buf(local_70,dst,local_8c);
    local_34 = 1;
  }
  else {
    if ((*(char *)(local_78 + 0x53) == '\0') && (local_98 != 0)) {
      if (1 < local_8c) {
        av1_enc_build_inter_predictor
                  (in_stack_ffffffffffffff30,xd_00,(int)((ulong)piVar4 >> 0x20),(int)piVar4,ctx,
                   (BLOCK_SIZE)((ulong)iVar3 >> 0x38),(int)pMVar5,in_stack_ffffffffffffff48);
      }
      *in_stack_00000040 = 1;
    }
    local_34 = 0;
  }
  return local_34;
}

Assistant:

static int process_compound_inter_mode(
    AV1_COMP *const cpi, MACROBLOCK *x, HandleInterModeArgs *args,
    int64_t ref_best_rd, int_mv *cur_mv, BLOCK_SIZE bsize,
    int *compmode_interinter_cost, const CompoundTypeRdBuffers *rd_buffers,
    const BUFFER_SET *orig_dst, const BUFFER_SET *tmp_dst, int *rate_mv,
    RD_STATS *rd_stats, int64_t *skip_rd, int *skip_build_pred) {
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const AV1_COMMON *cm = &cpi->common;
  const int masked_compound_used = is_any_masked_compound_used(bsize) &&
                                   cm->seq_params->enable_masked_compound;
  int mode_search_mask = (1 << COMPOUND_AVERAGE) | (1 << COMPOUND_DISTWTD) |
                         (1 << COMPOUND_WEDGE) | (1 << COMPOUND_DIFFWTD);

  const int num_planes = av1_num_planes(cm);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int is_luma_interp_done = 0;
  set_default_interp_filters(mbmi, cm->features.interp_filter);

  int64_t best_rd_compound;
  int64_t rd_thresh;
  const int comp_type_rd_shift = COMP_TYPE_RD_THRESH_SHIFT;
  const int comp_type_rd_scale = COMP_TYPE_RD_THRESH_SCALE;
  rd_thresh = get_rd_thresh_from_best_rd(ref_best_rd, (1 << comp_type_rd_shift),
                                         comp_type_rd_scale);
  // Select compound type and any parameters related to that type
  // (for example, the mask parameters if it is a masked mode) and compute
  // the RD
  *compmode_interinter_cost = av1_compound_type_rd(
      cpi, x, args, bsize, cur_mv, mode_search_mask, masked_compound_used,
      orig_dst, tmp_dst, rd_buffers, rate_mv, &best_rd_compound, rd_stats,
      ref_best_rd, skip_rd[1], &is_luma_interp_done, rd_thresh);
  if (ref_best_rd < INT64_MAX &&
      (best_rd_compound >> comp_type_rd_shift) * comp_type_rd_scale >
          ref_best_rd) {
    restore_dst_buf(xd, *orig_dst, num_planes);
    return 1;
  }

  // Build only uv predictor for COMPOUND_AVERAGE.
  // Note there is no need to call av1_enc_build_inter_predictor
  // for luma if COMPOUND_AVERAGE is selected because it is the first
  // candidate in av1_compound_type_rd, which means it used the dst_buf
  // rather than the tmp_buf.
  if (mbmi->interinter_comp.type == COMPOUND_AVERAGE && is_luma_interp_done) {
    if (num_planes > 1) {
      av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                    AOM_PLANE_U, num_planes - 1);
    }
    *skip_build_pred = 1;
  }
  return 0;
}